

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

void bio_verify_chksum(FILE *fp,int32 byteswap,uint32 chksum)

{
  uint uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  sVar2 = fread(&local_14,4,1,(FILE *)fp);
  if (sVar2 == 1) {
    uVar1 = local_14 >> 0x18 | (local_14 & 0xff0000) >> 8 | (local_14 & 0xff00) << 8 |
            local_14 << 0x18;
    if (byteswap == 0) {
      uVar1 = local_14;
    }
    if (uVar1 == chksum) {
      return;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x1f8,"Checksum error; file-checksum %08x, computed %08x\n",(ulong)uVar1,(ulong)chksum)
    ;
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x1f2,"fread(chksum) failed\n");
  }
  exit(1);
}

Assistant:

void
bio_verify_chksum(FILE * fp, int32 byteswap, uint32 chksum)
{
    uint32 file_chksum;

    if (fread(&file_chksum, sizeof(uint32), 1, fp) != 1)
        E_FATAL("fread(chksum) failed\n");
    if (byteswap)
        SWAP_INT32(&file_chksum);
    if (file_chksum != chksum)
        E_FATAL
            ("Checksum error; file-checksum %08x, computed %08x\n",
             file_chksum, chksum);
}